

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::InitData(ByteCodeWriter *this,ArenaAllocator *alloc,int32 initCodeBufferSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar4;
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar5;
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar6;
  Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
  *pSVar7;
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  
  if (this->isInUse == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x1f,"(!isInUse)","!isInUse");
    if (!bVar2) goto LAB_0088b142;
    *puVar3 = 0;
  }
  if (this->isInitialized == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x20,"(!isInitialized)","!isInitialized");
    if (!bVar2) goto LAB_0088b142;
    *puVar3 = 0;
  }
  this->isInitialized = true;
  pLVar4 = (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
  (pLVar4->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc = alloc;
  (pLVar4->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014d5058;
  (pLVar4->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
       (Type)0x0;
  (pLVar4->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  pLVar4->length = 0;
  pLVar4->increment = 4;
  this->m_labelOffsets = pLVar4;
  pLVar5 = (List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
  (pLVar5->super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
  ).alloc = alloc;
  (pLVar5->super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
  )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014de360;
  (pLVar5->super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
  ).buffer = (Type)0x0;
  (pLVar5->super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
  ).count = 0;
  pLVar5->length = 0;
  pLVar5->increment = 4;
  this->m_jumpOffsets = pLVar5;
  pLVar6 = (List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
  (pLVar6->
  super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>).
  alloc = alloc;
  (pLVar6->
  super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014de3b8;
  (pLVar6->
  super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer = (Type)0x0;
  (pLVar6->
  super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>).
  count = 0;
  pLVar6->length = 0;
  pLVar6->increment = 4;
  this->m_loopHeaders = pLVar6;
  Data::Create(&this->m_byteCodeData,initCodeBufferSize,alloc);
  pSVar7 = (Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
            *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
  (pSVar7->list).
  super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
  .alloc = alloc;
  (pSVar7->list).
  super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
  ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014de3e8;
  (pSVar7->list).
  super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
  .buffer = (Type)0x0;
  (pSVar7->list).
  super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
  .count = 0;
  (pSVar7->list).length = 0;
  (pSVar7->list).increment = 4;
  this->m_subexpressionNodesStack = pSVar7;
  Data::Create(&this->m_auxiliaryData,0x100,alloc);
  Data::Create(&this->m_auxContextData,0x100,alloc);
  this_00 = (BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,alloc,0x364470);
  this_00->buckets = (Type)0x0;
  this_00->entries = (Type)0x0;
  this_00->alloc = alloc;
  this_00->size = 0;
  this_00->bucketCount = 0;
  this_00->count = 0;
  this_00->freeCount = 0;
  this_00->modFunctionIndex = 0x4b;
  if (alloc == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                                ,0x8e,"(allocator)","allocator");
    if (!bVar2) {
LAB_0088b142:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00->stats = (Type)0x0;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Initialize(this_00,0x11);
  this->callRegToLdFldCacheIndexMap = this_00;
  this->useBranchIsland = true;
  this->inEnsureLongBranch = false;
  this->lastOpcode = FunctionEntry;
  UpdateNextBranchIslandOffset(this,0,0);
  pLVar5 = (List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            *)new<Memory::ArenaAllocator>(0x30,alloc,0x364470);
  (pLVar5->super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
  ).alloc = alloc;
  (pLVar5->super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
  )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014de360;
  (pLVar5->super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
  ).buffer = (Type)0x0;
  (pLVar5->super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
  ).count = 0;
  pLVar5->length = 0;
  pLVar5->increment = 4;
  this->m_longJumpOffsets = pLVar5;
  return;
}

Assistant:

void ByteCodeWriter::InitData(ArenaAllocator* alloc, int32 initCodeBufferSize)
    {
        Assert(!isInUse);
        Assert(!isInitialized);
        DebugOnly(isInitialized = true);

        m_labelOffsets = JsUtil::List<uint, ArenaAllocator>::New(alloc);
        m_jumpOffsets = JsUtil::List<JumpInfo, ArenaAllocator>::New(alloc);
        m_loopHeaders = JsUtil::List<LoopHeaderData, ArenaAllocator>::New(alloc);
        m_byteCodeData.Create(initCodeBufferSize, alloc);
        m_subexpressionNodesStack = Anew(alloc, JsUtil::Stack<SubexpressionNode>, alloc);

        // These data units have exponential growth strategy - let's start small and grow them
        m_auxiliaryData.Create(256, alloc);
        m_auxContextData.Create(256, alloc);
        callRegToLdFldCacheIndexMap = Anew(alloc, CallRegToLdFldCacheIndexMap,
            alloc,
            17);
#ifdef BYTECODE_BRANCH_ISLAND
        useBranchIsland = true;
        inEnsureLongBranch = false;
        lastOpcode = Js::OpCode::FunctionEntry;
        this->UpdateNextBranchIslandOffset(0, 0);
        m_longJumpOffsets = JsUtil::List<JumpInfo, ArenaAllocator>::New(alloc);
#endif
    }